

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

int Abc_NtkCollapseReduce(Vec_Str_t *vSop,Vec_Int_t *vSupp,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  uint uVar1;
  uint nCap;
  int *__s;
  uint uVar2;
  int i;
  int iVar3;
  int Entry;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p;
  int iVar6;
  char *pcVar7;
  int i_00;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  int local_64;
  
  if (vSop->nSize == 4) {
    local_64 = 1;
    for (iVar6 = 0; iVar6 < vClass->nSize; iVar6 = iVar6 + 1) {
      iVar3 = Vec_IntEntry(vClass,iVar6);
      pVVar5 = Vec_WecEntry(vSupps,iVar3);
      pVVar5->nSize = 0;
    }
  }
  else {
    nCap = vSupp->nSize;
    pcVar10 = vSop->pArray;
    pVVar5 = Vec_IntAlloc(nCap);
    pVVar5->nSize = nCap;
    __s = pVVar5->pArray;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)nCap * 4);
    }
    uVar1 = nCap + 3;
    uVar2 = nCap;
    if ((int)nCap < 1) {
      uVar2 = 0;
    }
    local_64 = 1;
    for (pcVar7 = pcVar10; *pcVar7 != '\0'; pcVar7 = pcVar7 + (int)uVar1) {
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        if (pcVar7[uVar8] != '-') {
          Vec_IntWriteEntry(pVVar5,(int)uVar8,1);
        }
      }
    }
    iVar6 = 0;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      iVar6 = iVar6 + (uint)(__s[uVar8] == 0);
    }
    if (iVar6 == 0) {
      local_64 = 0;
    }
    else {
      uVar8 = (ulong)uVar1;
      iVar6 = 0;
      if ((int)uVar1 < 1) {
        uVar8 = 0;
        iVar6 = 0;
      }
      for (; *pcVar10 != '\0'; pcVar10 = pcVar10 + (int)uVar1) {
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          if ((long)uVar9 < (long)(int)nCap) {
            iVar3 = Vec_IntEntry(pVVar5,(int)uVar9);
            if (iVar3 != 0) goto LAB_0026bd7b;
          }
          else {
LAB_0026bd7b:
            Vec_StrWriteEntry(vSop,iVar6,pcVar10[uVar9]);
            iVar6 = iVar6 + 1;
          }
        }
      }
      iVar3 = 0;
      Vec_StrWriteEntry(vSop,iVar6,'\0');
      if (vSop->nSize <= iVar6) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
      }
      vSop->nSize = iVar6 + 1;
      for (; iVar3 < vClass->nSize; iVar3 = iVar3 + 1) {
        iVar6 = Vec_IntEntry(vClass,iVar3);
        p = Vec_WecEntry(vSupps,iVar6);
        iVar6 = 0;
        for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
          Entry = Vec_IntEntry(p,i_00);
          iVar4 = Vec_IntEntry(pVVar5,i_00);
          if (iVar4 != 0) {
            Vec_IntWriteEntry(p,iVar6,Entry);
            iVar6 = iVar6 + 1;
          }
        }
        if (p->nSize < iVar6) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        p->nSize = iVar6;
      }
    }
    Vec_IntFree(pVVar5);
  }
  return local_64;
}

Assistant:

int Abc_NtkCollapseReduce( Vec_Str_t * vSop, Vec_Int_t * vSupp, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    int j = 0, i, k, iCo, iVar, nVars = Vec_IntSize(vSupp);
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Int_t * vPres;
    if ( Vec_StrSize(vSop) == 4 ) // constant
    {
        Vec_IntForEachEntry( vClass, iCo, i )
            Vec_IntClear( Vec_WecEntry(vSupps, iCo) );
        return 1;
    }
    vPres = Vec_IntStart( nVars );
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntWriteEntry( vPres, k, 1 );
    if ( Vec_IntCountZero(vPres) == 0 )
    {
        Vec_IntFree( vPres );
        return 0;
    }
    // reduce cubes
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars + 3; k++ )
            if ( k >= nVars || Vec_IntEntry(vPres, k) )
                Vec_StrWriteEntry( vSop, j++, pCube[k] );
    Vec_StrWriteEntry( vSop, j++, '\0' );
    Vec_StrShrink( vSop, j );
    // reduce support
    Vec_IntForEachEntry( vClass, iCo, i )
    {
        j = 0;
        vSupp = Vec_WecEntry( vSupps, iCo );
        Vec_IntForEachEntry( vSupp, iVar, k )
            if ( Vec_IntEntry(vPres, k) )
                Vec_IntWriteEntry( vSupp, j++, iVar );
        Vec_IntShrink( vSupp, j );
    }
    Vec_IntFree( vPres );
//    if ( Vec_IntSize(vSupp) != Abc_SopGetVarNum(Vec_StrArray(vSop)) )
//        printf( "Mismatch!!!\n" );
    return 1;
}